

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.h
# Opt level: O0

bool crnlib::pixel_format_helpers::is_alpha_only(pixel_format fmt)

{
  bool local_9;
  pixel_format fmt_local;
  
  if ((fmt == PIXEL_FMT_DXT5A) || (fmt == PIXEL_FMT_A8)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

inline bool is_alpha_only(pixel_format fmt)
        {
            switch (fmt)
            {
            case PIXEL_FMT_A8:
            case PIXEL_FMT_DXT5A:
                return true;
            default:
                break;
            }
            return false;
        }